

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

void tokinclude(tokcxdef *ctx,char *p,int len)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  undefined2 uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  linfdef *plVar10;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  errcxdef *ctx_00;
  tokpdef *path;
  size_t len_00;
  long lVar14;
  char *__s;
  
  if (len == 0) {
    ctx_00 = ctx->tokcxerr;
    iVar5 = 0x69;
LAB_001174e0:
    errlogf(ctx_00,"TADS",iVar5);
    return;
  }
  path = ctx->tokcxinc;
  bVar2 = *p;
  uVar12 = (uint)bVar2;
  if (bVar2 != 0x22) {
    if (bVar2 != 0x3c) {
      ctx_00 = ctx->tokcxerr;
      iVar5 = 0x6a;
      goto LAB_001174e0;
    }
    uVar12 = 0x3e;
    if (path == (tokpdef *)0x0) {
      path = (tokpdef *)0x0;
    }
    else if (path->tokpnxt != (tokpdef *)0x0) {
      path = path->tokpnxt;
    }
  }
  if (len == 1) {
    lVar13 = 1;
  }
  else {
    lVar7 = 1;
    do {
      if (uVar12 == (int)p[lVar7]) goto LAB_0011753d;
      lVar7 = lVar7 + 1;
      lVar13 = (ulong)(len - 2) + 2;
    } while (len != (int)lVar7);
  }
  lVar7 = lVar13;
  errlogf(ctx->tokcxerr,"TADS",0x6c);
LAB_0011753d:
  lVar13 = lVar7;
  if (lVar7 < 2) {
    len_00 = 0;
  }
  else {
    len_00 = 0;
    do {
      if ((p[lVar13 + -1] == '\0') || (p[lVar13 + -1] == '/')) goto LAB_00117582;
      len_00 = len_00 + 1;
      lVar13 = lVar13 + -1;
    } while ((1 - lVar7) + len_00 != 0);
    lVar13 = 1;
    len_00 = lVar7 - 1;
  }
LAB_00117582:
  pcVar11 = p + 1;
  iVar5 = (int)lVar7 + -1;
  plVar10 = ctx->tokcxhdr;
  if (plVar10 != (linfdef *)0x0) {
    do {
      sVar8 = strlen(plVar10->linfnam);
      lVar7 = sVar8 + 0x268;
      if (0x267 < lVar7) {
        lVar7 = 0x268;
      }
      lVar9 = sVar8 + 0x269;
      do {
        lVar1 = lVar9 + -1;
        lVar14 = lVar7;
        if ((lVar1 < 0x269) ||
           (cVar3 = *(char *)((long)plVar10 + lVar9 + -2), lVar14 = lVar1, cVar3 == '/')) break;
        lVar9 = lVar1;
      } while (cVar3 != '\0');
      __s = (char *)((long)&(plVar10->linflin).lingetp + lVar14);
      sVar8 = strlen(__s);
      if ((sVar8 == len_00) && (iVar6 = memicmp(__s,p + lVar13,len_00), iVar6 == 0)) {
        pcVar11 = errstr(ctx->tokcxerr,pcVar11,iVar5);
        ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar11;
        ctx->tokcxerr->errcxptr->erraac = 1;
        errlogn(ctx->tokcxerr,0x6f,"TADS");
        return;
      }
      plVar10 = (linfdef *)(plVar10->linflin).linnxt;
    } while (plVar10 != (linfdef *)0x0);
  }
  plVar10 = linfini(ctx->tokcxmem,ctx->tokcxerr,pcVar11,iVar5,path,1,(uint)ctx->tokcxflg >> 5 & 1);
  if (plVar10 == (linfdef *)0x0) {
    pcVar11 = errstr(ctx->tokcxerr,pcVar11,iVar5);
    ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar11;
    ctx->tokcxerr->errcxptr->erraac = 1;
    errsign(ctx->tokcxerr,0x6b,"TADS");
  }
  (plVar10->linflin).linnxt = &ctx->tokcxhdr->linflin;
  ctx->tokcxhdr = plVar10;
  if (ctx->tokcxdbg != (dbgcxdef *)0x0) {
    ctx->tokcxdbg->dbgcxlin = &plVar10->linflin;
    iVar5 = ctx->tokcxdbg->dbgcxfid;
    ctx->tokcxdbg->dbgcxfid = iVar5 + 1;
    (plVar10->linflin).linid = iVar5;
  }
  uVar4 = ctx->tokcxlin->linflg;
  ctx->tokcxlin->linflg = (uVar4 & 0xffef) + ((ushort)ctx->tokcxflg & 4) * 4;
  (plVar10->linflin).linpar = ctx->tokcxlin;
  ctx->tokcxlin = &plVar10->linflin;
  return;
}

Assistant:

static void tokinclude(tokcxdef *ctx, char *p, int len)
{
    linfdef *child;
    tokpdef *path;
    char    *fname;
    int      match;
    int      flen;
    linfdef *lin;
    char    *q;
    size_t   flen2;

    /* find the filename portion */
    fname = p + 1;                            /* remember start of filename */
    path = ctx->tokcxinc;                    /* start with first path entry */

    if (!len)
    {
        errlog(ctx->tokcxerr, ERR_INCNOFN);
        return;
    }
    
    switch(*p)
    {
    case '<':
        match = '>';
        if (path && path->tokpnxt) path = path->tokpnxt;   /* skip 1st path */
        goto find_matching_delim;

    case '"':
        match = '"';

    find_matching_delim:
        for (++p, --len ; len && *p != match ; --len, ++p) ;
        if (len == 0 || *p != match) errlog(ctx->tokcxerr, ERR_INCMTCH);
        break;
        
    default:
        errlog(ctx->tokcxerr, ERR_INCSYN);
        return;
    }
    
    flen = p - fname;                         /* compute length of filename */
    for (q = p, flen2 = 0 ;
         q > fname && *(q-1) != OSPATHCHAR && !strchr(OSPATHALT, *(q-1)) ;
         --q, ++flen2) ;
    
    /* check to see if this file has already been included */
    for (lin = ctx->tokcxhdr ; lin ; lin = (linfdef *)lin->linflin.linnxt)
    {
        char *p = lin->linfnam;
        
        p += strlen(p);
        
        while (p > lin->linfnam && *(p-1) != OSPATHCHAR
               && !strchr(OSPATHALT, *(p-1)))
            --p;
        if (strlen(p) == flen2
            && !memicmp(p, q, flen2))
        {
            errlog1(ctx->tokcxerr, ERR_INCRPT, ERRTSTR,
                    errstr(ctx->tokcxerr, fname, flen));
            return;
        }
    }
    
    /* initialize the line source */
    child = linfini(ctx->tokcxmem, ctx->tokcxerr, fname, flen, path, TRUE,
                    (ctx->tokcxflg & TOKCXFLIN2) != 0);
    
    /* if not found, signal an error */
    if (!child) errsig1(ctx->tokcxerr, ERR_INCSEAR,
                        ERRTSTR, errstr(ctx->tokcxerr, fname, flen));
    
    /* link into tokenizer list of line records */
    child->linflin.linnxt = (lindef *)ctx->tokcxhdr;
    ctx->tokcxhdr = child;

    /* if we're tracking sources for debugging, add into the chain */
    if (ctx->tokcxdbg)
    {
        ctx->tokcxdbg->dbgcxlin = &child->linflin;
        child->linflin.linid = ctx->tokcxdbg->dbgcxfid++;
    }

    /* remember my C-mode setting */
    if (ctx->tokcxflg & TOKCXFCMODE)
        ctx->tokcxlin->linflg |= LINFCMODE;
    else
        ctx->tokcxlin->linflg &= ~LINFCMODE;
    
    child->linflin.linpar = ctx->tokcxlin;   /* remember parent line source */
    ctx->tokcxlin = &child->linflin;   /* make the child the current source */
}